

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O0

void * pta_alloc(matras_allocator *allocator)

{
  matras_allocator *local_20;
  void *p;
  matras_allocator *allocator_local;
  
  if (alloc_err_inj_enabled) {
    if (alloc_err_inj_countdown == 0) {
      return (void *)0x0;
    }
    alloc_err_inj_countdown = alloc_err_inj_countdown - 1;
  }
  p = allocator;
  local_20 = (matras_allocator *)operator_new__(0x40);
  AllocatedCount = AllocatedCount + 1;
  std::set<void_*,_std::less<void_*>,_std::allocator<void_*>_>::insert(&AllocatedBlocks,&local_20);
  return local_20;
}

Assistant:

static void *
pta_alloc(struct matras_allocator *allocator)
{
	(void)allocator;
	if (alloc_err_inj_enabled) {
		if (alloc_err_inj_countdown == 0)
			return 0;
		alloc_err_inj_countdown--;
	}
	void *p = new char[PROV_EXTENT_SIZE];
	AllocatedCount++;
	AllocatedBlocks.insert(p);
	return p;
}